

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::FocusItem(void)

{
  ImGuiWindow *window;
  ImGuiScrollFlags scroll_flags;
  ImGuiContext *pIVar1;
  
  pIVar1 = GImGui;
  window = GImGui->CurrentWindow;
  if ((GImGui->DebugLogFlags & 2) != 0) {
    DebugLog("FocusItem(0x%08x) in window \"%s\"\n",(ulong)(GImGui->LastItemData).ID,window->Name);
  }
  if ((pIVar1->DragDropActive == false) && (pIVar1->MovingWindow == (ImGuiWindow *)0x0)) {
    scroll_flags = 3;
    if (window->Appearing != false) {
      scroll_flags = 0x21;
    }
    SetNavWindow(window);
    NavMoveRequestSubmit(ImGuiDir_None,ImGuiDir_Up,0x6600,scroll_flags);
    NavMoveRequestResolveWithLastItem(&pIVar1->NavMoveResultLocal);
    return;
  }
  if ((pIVar1->DebugLogFlags & 2) == 0) {
    return;
  }
  DebugLog("FocusItem() ignored while DragDropActive!\n");
  return;
}

Assistant:

void ImGui::FocusItem()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IMGUI_DEBUG_LOG_FOCUS("FocusItem(0x%08x) in window \"%s\"\n", g.LastItemData.ID, window->Name);
    if (g.DragDropActive || g.MovingWindow != NULL) // FIXME: Opt-in flags for this?
    {
        IMGUI_DEBUG_LOG_FOCUS("FocusItem() ignored while DragDropActive!\n");
        return;
    }

    ImGuiNavMoveFlags move_flags = ImGuiNavMoveFlags_IsTabbing | ImGuiNavMoveFlags_FocusApi | ImGuiNavMoveFlags_NoSetNavHighlight | ImGuiNavMoveFlags_NoSelect;
    ImGuiScrollFlags scroll_flags = window->Appearing ? ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_AlwaysCenterY : ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_KeepVisibleEdgeY;
    SetNavWindow(window);
    NavMoveRequestSubmit(ImGuiDir_None, ImGuiDir_Up, move_flags, scroll_flags);
    NavMoveRequestResolveWithLastItem(&g.NavMoveResultLocal);
}